

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O0

x86Reg GenCodeLoadInt32FromPointerIntoRegister(CodeGenRegVmContext *ctx,uchar reg,uint offset)

{
  x86Reg targetReg;
  int value;
  x86Reg targetReg_3;
  x86Reg targetReg_2;
  x86Reg targetReg_1;
  uint offset_local;
  uchar reg_local;
  CodeGenRegVmContext *ctx_local;
  
  if (reg == '\x03') {
    ctx_local._4_4_ =
         CodeGenGenericContext::FindRegAtMemory(&ctx->ctx,sDWORD,rNONE,1,rEBX,offset,true);
    if (ctx_local._4_4_ == rRegCount) {
      ctx_local._4_4_ = CodeGenGenericContext::GetReg(&ctx->ctx);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,ctx_local._4_4_,sDWORD,rEBX,offset);
    }
  }
  else if (reg == '\x01') {
    ctx_local._4_4_ =
         CodeGenGenericContext::FindRegAtMemory(&ctx->ctx,sDWORD,rNONE,1,rR15,offset,true);
    if (ctx_local._4_4_ == rRegCount) {
      ctx_local._4_4_ = CodeGenGenericContext::GetReg(&ctx->ctx);
      EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,ctx_local._4_4_,sDWORD,rR15,offset);
    }
  }
  else if (reg == '\x02') {
    ctx_local._4_4_ =
         CodeGenGenericContext::FindRegAtMemory(&ctx->ctx,sDWORD,rNONE,1,rR14,offset,true);
    if (ctx_local._4_4_ == rRegCount) {
      ctx_local._4_4_ = CodeGenGenericContext::GetReg(&ctx->ctx);
      if (ctx->exRegVmConstants[offset >> 2] == 0) {
        EMIT_OP_REG_REG(&ctx->ctx,o_xor,ctx_local._4_4_,ctx_local._4_4_);
      }
      else {
        EMIT_OP_REG_NUM(&ctx->ctx,o_mov,ctx_local._4_4_,ctx->exRegVmConstants[offset >> 2]);
      }
    }
  }
  else {
    ctx_local._4_4_ = CodeGenGenericContext::GetReg(&ctx->ctx);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,ctx_local._4_4_,sQWORD,rEBX,(uint)reg << 3);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,ctx_local._4_4_,sDWORD,ctx_local._4_4_,offset);
  }
  return ctx_local._4_4_;
}

Assistant:

x86Reg GenCodeLoadInt32FromPointerIntoRegister(CodeGenRegVmContext &ctx, unsigned char reg, unsigned offset)
{
	if(reg == rvrrRegisters)
	{
		x86Reg targetReg = ctx.ctx.FindRegAtMemory(sDWORD, rNONE, 1, rREG, offset, true);

		if(targetReg != rRegCount)
			return targetReg;

		targetReg = ctx.ctx.GetReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, targetReg, sDWORD, rREG, offset); // Load double value

		return targetReg;
	}

	if(reg == rvrrFrame)
	{
		x86Reg targetReg = ctx.ctx.FindRegAtMemory(sDWORD, rNONE, 1, rR15, offset, true);

		if(targetReg != rRegCount)
			return targetReg;

		targetReg = ctx.ctx.GetReg();

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, targetReg, sDWORD, rR15, offset); // Load double value

		return targetReg;
	}

	if(reg == rvrrConstants)
	{
		x86Reg targetReg = ctx.ctx.FindRegAtMemory(sDWORD, rNONE, 1, rR14, offset, true);

		if(targetReg != rRegCount)
			return targetReg;

		targetReg = ctx.ctx.GetReg();

		// Load int immediate
		int value = ctx.exRegVmConstants[offset >> 2];

		if(value == 0)
			EMIT_OP_REG_REG(ctx.ctx, o_xor, targetReg, targetReg);
		else
			EMIT_OP_REG_NUM(ctx.ctx, o_mov, targetReg, value);

		return targetReg;
	}

	x86Reg targetReg = ctx.ctx.GetReg();

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, targetReg, sQWORD, rREG, reg * 8); // Load source pointer
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, targetReg, sDWORD, targetReg, offset); // Load int value

	return targetReg;
}